

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_hdu_clear(NGP_HDU *ngph)

{
  char *pcVar1;
  void *__ptr;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (ngph != (NGP_HDU *)0x0) {
    iVar2 = ngph->tokcnt;
    if (0 < iVar2) {
      lVar3 = 0x50;
      lVar4 = 0;
      do {
        if ((*(int *)(ngph->tok->name + lVar3 + -0x54) == 2) &&
           (__ptr = *(void **)(ngph->tok->name + lVar3 + -4), __ptr != (void *)0x0)) {
          free(__ptr);
          pcVar1 = ngph->tok->name + lVar3 + -4;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          iVar2 = ngph->tokcnt;
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0xb0;
      } while (lVar4 < iVar2);
    }
    if (ngph->tok != (NGP_TOKEN *)0x0) {
      free(ngph->tok);
    }
    ngph->tok = (NGP_TOKEN *)0x0;
    ngph->tokcnt = 0;
    return 0;
  }
  return 0x16a;
}

Assistant:

int	ngp_hdu_clear(NGP_HDU *ngph)
 { int i;

   if (NULL == ngph) return(NGP_NUL_PTR);

   for (i=0; i<ngph->tokcnt; i++)
    { if (NGP_TTYPE_STRING == ngph->tok[i].type)
        if (NULL != ngph->tok[i].value.s)
          { ngp_free(ngph->tok[i].value.s);
            ngph->tok[i].value.s = NULL;
          }
    }

   if (NULL != ngph->tok) ngp_free(ngph->tok);

   ngph->tok = NULL;
   ngph->tokcnt = 0;

   return(NGP_OK);
 }